

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

int Cba_FonRangeSize(Cba_Ntk_t *p,int f)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  char *__nptr;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  if (f < 0) {
    __nptr = Abc_NamStr(p->pDesign->pFuns,~f);
    iVar6 = atoi(__nptr);
    return iVar6;
  }
  if (f == 0) {
    __assert_fail("Cba_FonIsReal(f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                  ,0x113,"int Cba_FonRange(Cba_Ntk_t *, int)");
  }
  if ((p->vFonRange).nSize < 1) {
    uVar5 = 0;
  }
  else {
    Vec_IntFillExtra(&p->vFonRange,f + 1,0);
    if ((p->vFonRange).nSize <= f) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar5 = (p->vFonRange).pArray[(uint)f];
  }
  if ((int)uVar5 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar4 = uVar5 >> 1;
  iVar7 = 0;
  iVar6 = 0;
  if (1 < uVar5) {
    pVVar3 = p->pDesign->vHash->vObjs;
    uVar1 = uVar4 * 4;
    uVar2 = pVVar3->nSize;
    if (uVar2 == uVar1 || SBORROW4(uVar2,uVar1) != (int)(uVar2 + uVar4 * -4) < 0) goto LAB_00872d48;
    iVar6 = pVVar3->pArray[uVar1];
  }
  if (1 < uVar5) {
    pVVar3 = p->pDesign->vHash->vObjs;
    if (pVVar3->nSize <= (int)(uVar4 * 4)) {
LAB_00872d48:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    iVar7 = pVVar3->pArray[(ulong)(uVar4 * 4) + 1];
  }
  iVar6 = iVar6 - iVar7;
  iVar7 = -iVar6;
  if (0 < iVar6) {
    iVar7 = iVar6;
  }
  return iVar7 + 1;
}

Assistant:

static inline int            Cba_FonRangeSize( Cba_Ntk_t * p, int f )        { return Cba_FonIsConst(f) ? Cba_FonConstRangeSize(p, f):Cba_NtkRangeSize(p, Cba_FonRange(p, f)); }